

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

void __thiscall ON_wString::UrlEncode(ON_wString *this)

{
  uint uVar1;
  int iVar2;
  wchar_t *pwVar3;
  ON_Internal_Empty_wString *pOVar4;
  wchar_t *s;
  wchar_t *__src;
  int *piVar5;
  size_t __n;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  pwVar3 = Array(this);
  pOVar4 = &empty_wstring;
  if (this->m_s != (wchar_t *)0x0) {
    pOVar4 = (ON_Internal_Empty_wString *)(this->m_s + -3);
  }
  uVar1 = (pOVar4->header).string_length;
  __n = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  s = (wchar_t *)0x0;
  piVar5 = (int *)0x0;
  for (; (uVar6 * 4 != __n && (iVar2 = *(int *)((long)pwVar3 + __n), iVar2 != 0)); __n = __n + 4) {
    if ((((iVar2 - 0x30U < 10) || (iVar2 - 0x61U < 0x1a)) || (iVar2 - 0x41U < 0x1a)) ||
       (0xff < iVar2)) {
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)0x0;
      }
      else {
        *piVar5 = iVar2;
        piVar5 = piVar5 + 1;
      }
    }
    else {
      if (piVar5 == (int *)0x0) {
        s = (wchar_t *)onmalloc((long)(int)uVar1 * 0xc + 4);
        if (__n != 0) {
          __src = Array(this);
          memcpy(s,__src,__n);
        }
        piVar5 = (int *)((long)s + __n);
      }
      *piVar5 = 0x25;
      iVar7 = (iVar2 / 0x10) % 0x10;
      uVar8 = -(uint)(9 < iVar7);
      uVar9 = -(uint)(9 < iVar2 % 0x10);
      *(ulong *)(piVar5 + 1) =
           CONCAT44((uVar9 & 0x37 | ~uVar9 & 0x30) + iVar2 % 0x10,
                    (uVar8 & 0x37 | ~uVar8 & 0x30) + iVar7);
      piVar5 = piVar5 + 3;
    }
  }
  if (piVar5 != (int *)0x0) {
    *piVar5 = 0;
    operator=(this,s);
    onfree(s);
    return;
  }
  return;
}

Assistant:

void ON_wString::UrlEncode()
{
  wchar_t c, c0, c1;
  wchar_t* buffer = 0;
  wchar_t* s1 = 0;
  const wchar_t* s = Array();
  const int count = Length();
  int i;

  for ( i = 0; i < count; i++ )
  {
    c = *s++;
    if ( 0 == c )
      break;
    if ('0' <= c && c <= '9')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if ('a' <= c && c <= 'z')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if ('A' <= c && c <= 'Z')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if (c >= 256)
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }

    // convert this character to %xx
    if ( !s1 )
    {
      buffer = (wchar_t*)onmalloc((count*3 + 1)*sizeof(buffer[0]));
      if ( i > 0 )
        memcpy(buffer,Array(),i*sizeof(buffer[0]));
      s1 = buffer+i;
    }
    c0 = ((c/16)%16) + '0';
    if ( c0 > '9' )
      c0 += ('A'-'9'-1);
    c1 = (c%16) + '0';
    if ( c1 > '9' )
      c1 += ('A'-'9'-1);
    *s1++ = '%';
    *s1++ = c0;
    *s1++ = c1;
  }
  if ( s1 )
  {
    *s1 = 0;
    *this = buffer;
    onfree(buffer);
  }
}